

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::AddActiveScriptPubKeyManWithDb
          (CWallet *this,WalletBatch *batch,uint256 id,OutputType type,bool internal)

{
  uint256 id_00;
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = WalletBatch::WriteActiveScriptPubKeyMan(batch,(uint8_t)type,&id,internal);
  if (bVar1) {
    id_00.super_base_blob<256U>.m_data._M_elems[8] = id.super_base_blob<256U>.m_data._M_elems[8];
    id_00.super_base_blob<256U>.m_data._M_elems[9] = id.super_base_blob<256U>.m_data._M_elems[9];
    id_00.super_base_blob<256U>.m_data._M_elems[10] = id.super_base_blob<256U>.m_data._M_elems[10];
    id_00.super_base_blob<256U>.m_data._M_elems[0xb] = id.super_base_blob<256U>.m_data._M_elems[0xb]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xc] = id.super_base_blob<256U>.m_data._M_elems[0xc]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xd] = id.super_base_blob<256U>.m_data._M_elems[0xd]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xe] = id.super_base_blob<256U>.m_data._M_elems[0xe]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xf] = id.super_base_blob<256U>.m_data._M_elems[0xf]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0] = id.super_base_blob<256U>.m_data._M_elems[0];
    id_00.super_base_blob<256U>.m_data._M_elems[1] = id.super_base_blob<256U>.m_data._M_elems[1];
    id_00.super_base_blob<256U>.m_data._M_elems[2] = id.super_base_blob<256U>.m_data._M_elems[2];
    id_00.super_base_blob<256U>.m_data._M_elems[3] = id.super_base_blob<256U>.m_data._M_elems[3];
    id_00.super_base_blob<256U>.m_data._M_elems[4] = id.super_base_blob<256U>.m_data._M_elems[4];
    id_00.super_base_blob<256U>.m_data._M_elems[5] = id.super_base_blob<256U>.m_data._M_elems[5];
    id_00.super_base_blob<256U>.m_data._M_elems[6] = id.super_base_blob<256U>.m_data._M_elems[6];
    id_00.super_base_blob<256U>.m_data._M_elems[7] = id.super_base_blob<256U>.m_data._M_elems[7];
    id_00.super_base_blob<256U>.m_data._M_elems[0x10] =
         id.super_base_blob<256U>.m_data._M_elems[0x10];
    id_00.super_base_blob<256U>.m_data._M_elems[0x11] =
         id.super_base_blob<256U>.m_data._M_elems[0x11];
    id_00.super_base_blob<256U>.m_data._M_elems[0x12] =
         id.super_base_blob<256U>.m_data._M_elems[0x12];
    id_00.super_base_blob<256U>.m_data._M_elems[0x13] =
         id.super_base_blob<256U>.m_data._M_elems[0x13];
    id_00.super_base_blob<256U>.m_data._M_elems[0x14] =
         id.super_base_blob<256U>.m_data._M_elems[0x14];
    id_00.super_base_blob<256U>.m_data._M_elems[0x15] =
         id.super_base_blob<256U>.m_data._M_elems[0x15];
    id_00.super_base_blob<256U>.m_data._M_elems[0x16] =
         id.super_base_blob<256U>.m_data._M_elems[0x16];
    id_00.super_base_blob<256U>.m_data._M_elems[0x17] =
         id.super_base_blob<256U>.m_data._M_elems[0x17];
    id_00.super_base_blob<256U>.m_data._M_elems[0x18] =
         id.super_base_blob<256U>.m_data._M_elems[0x18];
    id_00.super_base_blob<256U>.m_data._M_elems[0x19] =
         id.super_base_blob<256U>.m_data._M_elems[0x19];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
         id.super_base_blob<256U>.m_data._M_elems[0x1a];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
         id.super_base_blob<256U>.m_data._M_elems[0x1b];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
         id.super_base_blob<256U>.m_data._M_elems[0x1c];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
         id.super_base_blob<256U>.m_data._M_elems[0x1d];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
         id.super_base_blob<256U>.m_data._M_elems[0x1e];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
         id.super_base_blob<256U>.m_data._M_elems[0x1f];
    LoadActiveScriptPubKeyMan(this,id_00,type,internal);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"AddActiveScriptPubKeyManWithDb","");
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,": writing active ScriptPubKeyMan id failed");
    local_50 = (size_type *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50 == paVar3) {
      local_40 = paVar3->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_50 = &local_40;
    }
    else {
      local_40 = paVar3->_M_allocated_capacity;
    }
    local_48 = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddActiveScriptPubKeyManWithDb(WalletBatch& batch, uint256 id, OutputType type, bool internal)
{
    if (!batch.WriteActiveScriptPubKeyMan(static_cast<uint8_t>(type), id, internal)) {
        throw std::runtime_error(std::string(__func__) + ": writing active ScriptPubKeyMan id failed");
    }
    LoadActiveScriptPubKeyMan(id, type, internal);
}